

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int strlen_html(SXML_CHAR *str)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (str == (SXML_CHAR *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    for (lVar3 = 0; str[lVar3] != '\0'; lVar3 = lVar3 + 1) {
      lVar1 = 0;
      do {
        lVar4 = lVar1;
        if (lVar4 + 0x18 == 0x90) goto LAB_00105f75;
        lVar1 = lVar4 + 0x18;
      } while (str[lVar3] != (&HTML_SPECIAL_DICT[0].chr)[lVar4]);
      iVar2 = iVar2 + *(int *)((long)&HTML_SPECIAL_DICT[0].html_len + lVar4);
LAB_00105f75:
      iVar2 = iVar2 + (uint)((&HTML_SPECIAL_DICT[0].chr)[lVar4] == '\0');
    }
  }
  return iVar2;
}

Assistant:

int strlen_html(SXML_CHAR* str)
{
	int i, j, n;
	
	if (str == NULL)
		return 0;

	n = 0;
	for (i = 0; str[i] != NULC; i++) {
		for (j = 0; HTML_SPECIAL_DICT[j].chr; j++) {
			if (str[i] == HTML_SPECIAL_DICT[j].chr) {
				n += HTML_SPECIAL_DICT[j].html_len;
				break;
			}
		}
		if (HTML_SPECIAL_DICT[j].chr == NULC)
			n++;
	}

	return n;
}